

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O3

void parseTzLeapSeconds(QDataStream *ds,int tzh_leapcnt,bool longTran)

{
  Status SVar1;
  undefined3 in_register_00000011;
  long in_FS_OFFSET;
  qint64 time;
  qint32 val;
  undefined1 *local_38;
  qint32 local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = -0x55555556;
  if (CONCAT31(in_register_00000011,longTran) == 0) {
    if (0 < tzh_leapcnt) {
      do {
        SVar1 = QDataStream::status(ds);
        if (SVar1 != Ok) break;
        QDataStream::operator>>(ds,&local_2c);
        SVar1 = QDataStream::status(ds);
        if (SVar1 == Ok) {
          QDataStream::operator>>(ds,&local_2c);
        }
        tzh_leapcnt = tzh_leapcnt + -1;
      } while (tzh_leapcnt != 0);
    }
  }
  else {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    if (0 < tzh_leapcnt) {
      do {
        SVar1 = QDataStream::status(ds);
        if (SVar1 != Ok) break;
        QDataStream::operator>>(ds,(qint64 *)&local_38);
        SVar1 = QDataStream::status(ds);
        if (SVar1 == Ok) {
          QDataStream::operator>>(ds,&local_2c);
        }
        tzh_leapcnt = tzh_leapcnt + -1;
      } while (tzh_leapcnt != 0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void parseTzLeapSeconds(QDataStream &ds, int tzh_leapcnt, bool longTran)
{
    // Parse tzh_leapcnt x pairs of leap seconds
    // We don't use leap seconds, so only read and don't store
    qint32 val;
    if (longTran) {
        // v2 file format, each entry is 12 bytes long
        qint64 time;
        for (int i = 0; i < tzh_leapcnt && ds.status() == QDataStream::Ok; ++i) {
            // Parse Leap Occurrence Time, 8 bytes
            ds >> time;
            // Parse Leap Seconds To Apply, 4 bytes
            if (ds.status() == QDataStream::Ok)
                ds >> val;
        }
    } else {
        // v0 file format, each entry is 8 bytes long
        for (int i = 0; i < tzh_leapcnt && ds.status() == QDataStream::Ok; ++i) {
            // Parse Leap Occurrence Time, 4 bytes
            ds >> val;
            // Parse Leap Seconds To Apply, 4 bytes
            if (ds.status() == QDataStream::Ok)
                ds >> val;
        }
    }
}